

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::CodeHolder::bindLabel
          (CodeHolder *this,Label *label,uint32_t toSectionId,uint64_t toOffset)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  Error EVar7;
  int *piVar8;
  long lVar9;
  undefined8 *puVar10;
  int extraout_EDX;
  ulong uVar11;
  ZoneAllocator *allocator;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 *puVar16;
  long lVar17;
  undefined8 *puVar18;
  size_t sStack_68;
  uint64_t uStack_60;
  Error local_34;
  
  uVar2 = (label->super_Operand).super_Operand_._baseId;
  if (uVar2 < *(uint *)&this->field_0x100) {
    lVar17 = *(long *)(*(long *)&this->_labelEntries + (ulong)uVar2 * 8);
  }
  else {
    lVar17 = 0;
  }
  if (lVar17 == 0) {
LAB_0011947e:
    local_34 = 0xc;
  }
  else if (*(uint *)&this->field_0xe0 < toSectionId) {
    local_34 = 0x13;
  }
  else if (*(long *)(lVar17 + 0x20) == 0) {
    if (*(uint *)&this->field_0xe0 <= toSectionId) {
      bindLabel();
      allocator = &this->_allocator;
      EVar7 = 0;
      uStack_60 = toOffset;
      if (*(int *)&this->field_0x114 == *(int *)&this->field_0x110) {
        EVar7 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_relocations,allocator,8,1);
      }
      if (EVar7 == 0) {
        iVar3 = *(int *)&this->field_0x110;
        if (iVar3 == -1) {
          EVar7 = 0x16;
        }
        else {
          if (*(long *)allocator == 0) {
            newRelocEntry();
          }
          else {
            piVar8 = (int *)ZoneAllocator::_allocZeroed(allocator,0x28,&sStack_68);
            if (piVar8 != (int *)0x0) {
              *piVar8 = iVar3;
              piVar8[1] = extraout_EDX;
              piVar8[4] = -1;
              piVar8[5] = -1;
              if (*(uint *)&this->field_0x110 < *(uint *)&this->field_0x114) {
                *(int **)(*(long *)&this->_relocations + (ulong)*(uint *)&this->field_0x110 * 8) =
                     piVar8;
                *(int *)&this->field_0x110 = *(int *)&this->field_0x110 + 1;
                *(int **)&(label->super_Operand).super_Operand_ = piVar8;
                return 0;
              }
              newRelocEntry();
              lVar17 = *(long *)(allocator + 0xe8);
              uVar11 = (ulong)*(uint *)(allocator + 0xf0);
              bVar6 = uVar11 == 0;
              if (!bVar6) {
                lVar12 = 0;
                uVar15 = 0;
                do {
                  lVar9 = *(long *)(lVar17 + lVar12);
                  uVar13 = *(ulong *)(lVar9 + 0x50);
                  if (*(ulong *)(lVar9 + 0x50) < *(ulong *)(lVar9 + 0x18)) {
                    uVar13 = *(ulong *)(lVar9 + 0x18);
                  }
                  if (uVar13 == 0) {
                    bVar5 = true;
                  }
                  else {
                    uVar14 = -(ulong)*(uint *)(lVar9 + 8) & (uVar15 + *(uint *)(lVar9 + 8)) - 1;
                    if (uVar14 < uVar15) {
                      bVar5 = false;
                    }
                    else {
                      uVar15 = uVar14 + uVar13;
                      bVar5 = !CARRY8(uVar14,uVar13);
                    }
                  }
                  if (!bVar5) break;
                  lVar12 = lVar12 + 8;
                  bVar6 = uVar11 * 8 - lVar12 == 0;
                } while (!bVar6);
              }
              EVar7 = 9;
              if (bVar6) {
                if (uVar11 != 0) {
                  lVar9 = 0;
                  uVar15 = 0;
                  lVar12 = 0;
                  do {
                    lVar4 = *(long *)(lVar17 + lVar9);
                    uVar13 = *(ulong *)(lVar4 + 0x50);
                    if (*(ulong *)(lVar4 + 0x50) < *(ulong *)(lVar4 + 0x18)) {
                      uVar13 = *(ulong *)(lVar4 + 0x18);
                    }
                    if (uVar13 != 0) {
                      uVar15 = -(ulong)*(uint *)(lVar4 + 8) & (uVar15 + *(uint *)(lVar4 + 8)) - 1;
                    }
                    *(ulong *)(lVar4 + 0x10) = uVar15;
                    if (lVar12 != 0) {
                      *(ulong *)(lVar12 + 0x18) = uVar15 - *(long *)(lVar12 + 0x10);
                    }
                    uVar15 = uVar15 + uVar13;
                    lVar9 = lVar9 + 8;
                    lVar12 = lVar4;
                  } while (uVar11 << 3 != lVar9);
                }
                EVar7 = 0;
              }
              return EVar7;
            }
          }
          EVar7 = 1;
        }
      }
      return EVar7;
    }
    lVar12 = *(long *)(*(long *)&this->_sections + (ulong)toSectionId * 8);
    *(long *)(lVar17 + 0x20) = lVar12;
    *(uint64_t *)(lVar17 + 0x18) = toOffset;
    if (*(undefined8 **)(lVar17 + 0x28) == (undefined8 *)0x0) {
      local_34 = 0;
    }
    else {
      puVar18 = (undefined8 *)(lVar17 + 0x28);
      local_34 = 0;
      puVar16 = *(undefined8 **)(lVar17 + 0x28);
      do {
        uVar2 = *(uint *)((long)puVar16 + 0xc);
        if ((ulong)uVar2 != 0xffffffff) {
          if (uVar2 < *(uint *)&this->field_0x110) {
            lVar17 = *(long *)(*(long *)&this->_relocations + (ulong)uVar2 * 8);
            plVar1 = (long *)(lVar17 + 0x20);
            *plVar1 = *plVar1 + toOffset;
            *(uint32_t *)(lVar17 + 0x14) = toSectionId;
LAB_001193a1:
            puVar10 = (undefined8 *)*puVar16;
            *puVar18 = puVar10;
            this->_unresolvedLinkCount = this->_unresolvedLinkCount - 1;
            if (*(long *)&this->_allocator != 0) {
              *puVar16 = *(undefined8 *)&this->field_0x78;
              *(undefined8 **)&this->field_0x78 = puVar16;
              goto LAB_00119441;
            }
            bindLabel();
          }
          bindLabel();
LAB_00119474:
          bindLabel();
LAB_00119479:
          bindLabel();
          goto LAB_0011947e;
        }
        if (*(uint32_t *)(puVar16 + 1) == toSectionId) {
          uVar11 = puVar16[2];
          if (*(ulong *)(lVar12 + 0x50) <= uVar11) goto LAB_00119474;
          if ((ulong)*(byte *)((long)puVar16 + 0x22) <= *(ulong *)(lVar12 + 0x50) - uVar11) {
            bVar6 = CodeWriterUtils::writeOffset
                              ((void *)(uVar11 + *(long *)(lVar12 + 0x48)),
                               (toOffset - uVar11) + puVar16[3],(OffsetFormat *)(puVar16 + 4));
            if (bVar6) goto LAB_001193a1;
            puVar10 = (undefined8 *)*puVar16;
            local_34 = 0x30;
            puVar18 = puVar16;
            goto LAB_00119441;
          }
          goto LAB_00119479;
        }
        puVar10 = (undefined8 *)*puVar16;
        puVar18 = puVar16;
LAB_00119441:
        puVar16 = puVar10;
      } while (puVar10 != (undefined8 *)0x0);
    }
  }
  else {
    local_34 = 0xe;
  }
  return local_34;
}

Assistant:

ASMJIT_API Error CodeHolder::bindLabel(const Label& label, uint32_t toSectionId, uint64_t toOffset) noexcept {
  LabelEntry* le = labelEntry(label);
  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (ASMJIT_UNLIKELY(toSectionId > _sections.size()))
    return DebugUtils::errored(kErrorInvalidSection);

  // Label can be bound only once.
  if (ASMJIT_UNLIKELY(le->isBound()))
    return DebugUtils::errored(kErrorLabelAlreadyBound);

  // Bind the label.
  Section* section = _sections[toSectionId];
  le->_section = section;
  le->_offset = toOffset;

  Error err = kErrorOk;
  CodeBuffer& buf = section->buffer();

  // Fix all links to this label we have collected so far if they are within
  // the same section. We ignore any inter-section links as these have to be
  // fixed later.
  LabelLinkIterator link(le);
  while (link) {
    uint32_t linkSectionId = link->sectionId;
    size_t linkOffset = link->offset;

    uint32_t relocId = link->relocId;
    if (relocId != Globals::kInvalidId) {
      // Adjust relocation data only.
      RelocEntry* re = _relocations[relocId];
      re->_payload += toOffset;
      re->_targetSectionId = toSectionId;
    }
    else {
      if (linkSectionId != toSectionId) {
        link.next();
        continue;
      }

      ASMJIT_ASSERT(linkOffset < buf.size());
      int64_t displacement = int64_t(toOffset - uint64_t(linkOffset) + uint64_t(int64_t(link->rel)));

      // Size of the value we are going to patch. Only BYTE/DWORD is allowed.
      ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.regionSize());

      // Overwrite a real displacement in the CodeBuffer.
      if (!CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
        err = DebugUtils::errored(kErrorInvalidDisplacement);
        link.next();
        continue;
      }
    }

    link.resolveAndNext(this);
  }

  return err;
}